

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int64_t quicly_get_first_timeout(quicly_conn_t *conn)

{
  uint64_t *puVar1;
  size_t *psVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  quicly_stream_t *pqVar8;
  int64_t iVar9;
  long lVar10;
  ulong uVar11;
  
  if ((conn->super).state < QUICLY_STATE_CLOSING) {
    if ((((conn->egress).datagram_frame_payloads.count == 0) ||
        (conn->application == (st_quicly_application_space_t *)0x0)) ||
       ((conn->application->cipher).egress.key.aead == (ptls_aead_context_t *)0x0)) {
      uVar11 = 0xffffffffffffffff;
      if (((uint)(conn->super).remote.address_validation & 1) == 0) {
        uVar6 = (ulong)((conn->super).ctx)->pre_validation_amplification_limit *
                (conn->super).stats.num_bytes.received;
        puVar1 = &(conn->super).stats.num_bytes.sent;
        uVar11 = 0;
        if (*puVar1 <= uVar6) {
          uVar11 = uVar6 - *puVar1;
        }
      }
      uVar7 = (ulong)(conn->egress).cc.cwnd;
      psVar2 = &(conn->egress).loss.sentmap.bytes_in_flight;
      uVar6 = 0;
      if (*psVar2 <= uVar7) {
        uVar6 = uVar7 - *psVar2;
      }
      if (uVar11 <= uVar6) {
        uVar6 = uVar11;
      }
      if ((uVar6 == 0) ||
         ((((conn->egress).pending_flows == '\0' &&
           ((conn->egress).pending_streams.control.prev == &(conn->egress).pending_streams.control))
          && (iVar5 = scheduler_can_send(conn), iVar5 == 0)))) {
        lVar3 = (conn->idle_timeout).at;
        if (uVar11 == 0) {
          return lVar3;
        }
        lVar4 = (conn->egress).loss.alarm_at;
        lVar10 = lVar3;
        if (((lVar4 < lVar3) &&
            (lVar10 = lVar4, conn->handshake != (st_quicly_handshake_space_t *)0x0)) &&
           ((conn->application != (st_quicly_application_space_t *)0x0 &&
            (((conn->super).local.bidi.next_stream_id & 1) != 0)))) {
          pqVar8 = quicly_get_stream(conn,-3);
          if (pqVar8 == (quicly_stream_t *)0x0) {
            __assert_fail("stream != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0xb38,"int is_point5rtt_with_no_handshake_data_to_send(quicly_conn_t *)")
            ;
          }
          if (((pqVar8->sendstate).pending.num_ranges == 0) &&
             (lVar10 = lVar3,
             ((pqVar8->sendstate).acked.ranges)->end != (pqVar8->sendstate).size_inflight)) {
            lVar10 = lVar4;
          }
        }
        lVar3 = (conn->egress).send_ack_at;
        if (lVar10 <= lVar3) {
          return lVar10;
        }
        return lVar3;
      }
    }
    iVar9 = 0;
  }
  else {
    iVar9 = (conn->egress).send_ack_at;
  }
  return iVar9;
}

Assistant:

int64_t quicly_get_first_timeout(quicly_conn_t *conn)
{
    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return conn->egress.send_ack_at;

    if (should_send_datagram_frame(conn))
        return 0;

    uint64_t amp_window = calc_amplification_limit_allowance(conn);

    if (calc_send_window(conn, 0, amp_window, 0) > 0) {
        if (conn->egress.pending_flows != 0)
            return 0;
        if (quicly_linklist_is_linked(&conn->egress.pending_streams.control))
            return 0;
        if (scheduler_can_send(conn))
            return 0;
    }

    /* if something can be sent, return the earliest timeout. Otherwise return the idle timeout. */
    int64_t at = conn->idle_timeout.at;
    if (amp_window > 0) {
        if (conn->egress.loss.alarm_at < at && !is_point5rtt_with_no_handshake_data_to_send(conn))
            at = conn->egress.loss.alarm_at;
        if (conn->egress.send_ack_at < at)
            at = conn->egress.send_ack_at;
    }

    return at;
}